

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O0

void __thiscall
QAbstractItemView::setItemDelegateForColumn
          (QAbstractItemView *this,int column,QAbstractItemDelegate *delegate)

{
  long lVar1;
  int iVar2;
  QAbstractItemViewPrivate *pQVar3;
  QAbstractItemViewPrivate *this_00;
  long in_RDX;
  undefined4 in_ESI;
  QAbstractScrollArea *in_RDI;
  long in_FS_OFFSET;
  QAbstractItemDelegate *columnDelegate;
  QAbstractItemViewPrivate *d;
  QWidget *in_stack_ffffffffffffff78;
  QMap<int,_QPointer<QAbstractItemDelegate>_> *key;
  QPointer<QAbstractItemDelegate> *in_stack_ffffffffffffff90;
  QAbstractItemViewPrivate *in_stack_ffffffffffffff98;
  QMap<int,_QPointer<QAbstractItemDelegate>_> *in_stack_ffffffffffffffa0;
  QAbstractScrollArea *delegate_00;
  QAbstractItemDelegate *in_stack_ffffffffffffffd8;
  QAbstractItemViewPrivate *in_stack_ffffffffffffffe0;
  QAbstractItemDelegate *in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  delegate_00 = in_RDI;
  pQVar3 = d_func((QAbstractItemView *)0x801d79);
  key = &pQVar3->columnDelegates;
  QPointer<QAbstractItemDelegate>::QPointer
            ((QPointer<QAbstractItemDelegate> *)in_RDI,in_stack_ffffffffffffff78);
  QMap<int,_QPointer<QAbstractItemDelegate>_>::value
            (in_stack_ffffffffffffffa0,(int *)in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  this_00 = (QAbstractItemViewPrivate *)
            ::QPointer::operator_cast_to_QAbstractItemDelegate_
                      ((QPointer<QAbstractItemDelegate> *)0x801dbf);
  QPointer<QAbstractItemDelegate>::~QPointer((QPointer<QAbstractItemDelegate> *)0x801dce);
  QPointer<QAbstractItemDelegate>::~QPointer((QPointer<QAbstractItemDelegate> *)0x801dd8);
  if (this_00 != (QAbstractItemViewPrivate *)0x0) {
    iVar2 = QAbstractItemViewPrivate::delegateRefCount
                      (in_stack_ffffffffffffff98,(QAbstractItemDelegate *)delegate_00);
    if (iVar2 == 1) {
      QAbstractItemViewPrivate::disconnectDelegate
                ((QAbstractItemViewPrivate *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                 in_stack_ffffffffffffffe8);
    }
    QMap<int,_QPointer<QAbstractItemDelegate>_>::remove
              (&pQVar3->columnDelegates,&stack0xfffffffffffffff4);
  }
  if (in_RDX != 0) {
    iVar2 = QAbstractItemViewPrivate::delegateRefCount
                      (in_stack_ffffffffffffff98,(QAbstractItemDelegate *)delegate_00);
    if (iVar2 == 0) {
      QAbstractItemViewPrivate::connectDelegate(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8)
      ;
    }
    in_stack_ffffffffffffff78 = (QWidget *)&pQVar3->columnDelegates;
    QPointer<QAbstractItemDelegate>::QPointer<void>
              ((QPointer<QAbstractItemDelegate> *)in_RDI,
               (QAbstractItemDelegate *)in_stack_ffffffffffffff78);
    QMap<int,_QPointer<QAbstractItemDelegate>_>::insert
              ((QMap<int,_QPointer<QAbstractItemDelegate>_> *)this_00,(int *)key,
               (QPointer<QAbstractItemDelegate> *)in_RDI);
    QPointer<QAbstractItemDelegate>::~QPointer((QPointer<QAbstractItemDelegate> *)0x801e8e);
  }
  iVar2 = (int)((ulong)key >> 0x20);
  QAbstractScrollArea::viewport(in_RDI);
  QWidget::update(in_stack_ffffffffffffff78);
  QAbstractItemViewPrivate::doDelayedItemsLayout(this_00,iVar2);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemView::setItemDelegateForColumn(int column, QAbstractItemDelegate *delegate)
{
    Q_D(QAbstractItemView);
    if (QAbstractItemDelegate *columnDelegate = d->columnDelegates.value(column, nullptr)) {
        if (d->delegateRefCount(columnDelegate) == 1)
            d->disconnectDelegate(columnDelegate);
        d->columnDelegates.remove(column);
    }
    if (delegate) {
        if (d->delegateRefCount(delegate) == 0)
            d->connectDelegate(delegate);
        d->columnDelegates.insert(column, delegate);
    }
    viewport()->update();
    d->doDelayedItemsLayout();
}